

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_time.cpp
# Opt level: O1

void mbedtls_ct_memmove_left(void *start,size_t total,size_t offset)

{
  byte *pbVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  
  if (total != 0) {
    uVar2 = 0;
    do {
      uVar6 = mbedtls_ct_zero ^ total - offset;
      uVar4 = (long)(-(mbedtls_ct_zero >> 1) |
                    -((uVar6 ^ mbedtls_ct_zero ^ uVar2) >> 0x3f ^ mbedtls_ct_zero)) >> 0x3f;
      bVar3 = (char)((byte)(-(mbedtls_ct_zero >> 1) >> 0x38) |
                    (byte)(-((uVar4 & uVar6 |
                             ~(mbedtls_ct_zero ^ uVar4) & (mbedtls_ct_zero ^ uVar2) - uVar6) >> 0x3f
                            ^ mbedtls_ct_zero) >> 0x38)) >> 7;
      if (total != 1) {
        sVar5 = 1;
        do {
          *(byte *)((long)start + (sVar5 - 1)) =
               *(byte *)((long)start + sVar5) & ~((byte)mbedtls_ct_zero ^ bVar3) |
               *(byte *)((long)start + (sVar5 - 1)) & bVar3;
          sVar5 = sVar5 + 1;
        } while (total != sVar5);
      }
      pbVar1 = (byte *)((long)start + (total - 1));
      *pbVar1 = *pbVar1 & bVar3;
      uVar2 = uVar2 + 1;
    } while (uVar2 != total);
  }
  return;
}

Assistant:

void mbedtls_ct_memmove_left(void *start, size_t total, size_t offset)
{
    volatile unsigned char *buf = (unsigned char *) start;
    for (size_t i = 0; i < total; i++) {
        mbedtls_ct_condition_t no_op = mbedtls_ct_uint_gt(total - offset, i);
        /* The first `total - offset` passes are a no-op. The last
         * `offset` passes shift the data one byte to the left and
         * zero out the last byte. */
        for (size_t n = 0; n < total - 1; n++) {
            unsigned char current = buf[n];
            unsigned char next    = buf[n+1];
            buf[n] = mbedtls_ct_uint_if(no_op, current, next);
        }
        buf[total-1] = mbedtls_ct_uint_if_else_0(no_op, buf[total-1]);
    }
}